

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall
QtPrivate::QWellArray::paintCellContents(QWellArray *this,QPainter *p,int row,int col,QRect *r)

{
  QRect *in_RSI;
  QPainter *in_R8;
  long in_FS_OFFSET;
  QRect *this_00;
  undefined8 in_stack_ffffffffffffff98;
  QRect *p2;
  QRect *in_stack_ffffffffffffffa0;
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPainter::fillRect(in_R8,in_stack_ffffffffffffffa0,
                     (GlobalColor)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  this_00 = in_RSI;
  QColor::QColor(&local_18,black);
  QPainter::setPen((QColor *)this_00);
  p2 = in_RSI;
  QRect::topLeft(this_00);
  QRect::bottomRight(this_00);
  QPainter::drawLine(in_R8,(QPoint *)in_stack_ffffffffffffffa0,(QPoint *)p2);
  QRect::topRight(this_00);
  QRect::bottomLeft(this_00);
  QPainter::drawLine(in_R8,(QPoint *)in_RSI,(QPoint *)p2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWellArray::paintCellContents(QPainter *p, int row, int col, const QRect &r)
{
    Q_UNUSED(row);
    Q_UNUSED(col);
    p->fillRect(r, Qt::white);
    p->setPen(Qt::black);
    p->drawLine(r.topLeft(), r.bottomRight());
    p->drawLine(r.topRight(), r.bottomLeft());
}